

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::optimizePowerOf2Mul<unsigned_int>
          (OptimizeInstructions *this,Binary *binary,uint c)

{
  anon_union_16_6_1532cd5a_for_Literal_0 local_28;
  undefined8 local_18;
  
  local_28.i32 = Bits::countTrailingZeroes(c);
  binary->op = ShlInt32;
  local_18 = 2;
  if (binary->right->_id == ConstId) {
    Literal::operator=((Literal *)(binary->right + 1),(Literal *)&local_28.func);
    Literal::~Literal((Literal *)&local_28.func);
    return (Expression *)binary;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
}

Assistant:

Expression* optimizePowerOf2Mul(Binary* binary, T c) {
    static_assert(std::is_same<T, uint32_t>::value ||
                    std::is_same<T, uint64_t>::value,
                  "type mismatch");
    auto shifts = Bits::countTrailingZeroes(c);
    binary->op = std::is_same<T, uint32_t>::value ? ShlInt32 : ShlInt64;
    binary->right->cast<Const>()->value = Literal(static_cast<T>(shifts));
    return binary;
  }